

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::name_conflict_error::name_conflict_error
          (name_conflict_error *this,string *t_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *t_name_local;
  name_conflict_error *this_local;
  
  local_18 = t_name;
  t_name_local = (string *)this;
  std::operator+(&local_38,"Name already exists in current context ",t_name);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__name_conflict_error_008797a8;
  std::__cxx11::string::string((string *)&this->m_name,local_18);
  return;
}

Assistant:

explicit name_conflict_error(const std::string &t_name) noexcept
          : std::runtime_error("Name already exists in current context " + t_name)
          , m_name(t_name) {
      }